

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fthash.c
# Opt level: O2

FT_Error ft_hash_str_init(FT_Hash hash,FT_Memory memory)

{
  FT_Error FVar1;
  
  FVar1 = hash_init(hash,'\0',memory);
  return FVar1;
}

Assistant:

FT_Error
  ft_hash_str_init( FT_Hash    hash,
                    FT_Memory  memory )
  {
    return hash_init( hash, 0, memory );
  }